

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_cParam_clampBounds(ZSTD_cParameter cParam,int *value)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  ZSTD_bounds ZVar6;
  
  ZVar6 = ZSTD_cParam_getBounds(cParam);
  sVar3 = ZVar6.error;
  if (sVar3 < 0xffffffffffffff89) {
    iVar1 = *value;
    iVar4 = ZVar6.lowerBound;
    iVar2 = iVar1;
    if (iVar1 <= iVar4) {
      iVar2 = iVar4;
    }
    iVar5 = ZVar6.upperBound;
    if (iVar1 < iVar4 || iVar5 < iVar2) {
      if (iVar2 < iVar5) {
        iVar5 = iVar2;
      }
      *value = iVar5;
    }
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static size_t ZSTD_cParam_clampBounds(ZSTD_cParameter cParam, int* value)
{
    ZSTD_bounds const bounds = ZSTD_cParam_getBounds(cParam);
    if (ZSTD_isError(bounds.error)) return bounds.error;
    if (*value < bounds.lowerBound) *value = bounds.lowerBound;
    if (*value > bounds.upperBound) *value = bounds.upperBound;
    return 0;
}